

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int SDL_ShowCursor(int toggle)

{
  SDL_bool SVar1;
  
  SVar1 = VideoCursorHidden;
  if ((-1 < toggle) && (VideoCursorHidden != (toggle == 0))) {
    (*SDL20_ShowCursor)(SUB14(toggle != 0,0));
    VideoCursorHidden = (uint)(toggle == 0);
    UpdateRelativeMouseMode();
  }
  return (int)(SVar1 == SDL_FALSE);
}

Assistant:

SDLCALL
SDL_ShowCursor(int toggle)
{
    const int retval = VideoCursorHidden ? 0 : 1;

    if (toggle >= 0) {
        const SDL_bool wanthide = (toggle == 0) ? SDL_TRUE : SDL_FALSE;
        if (VideoCursorHidden != wanthide) {
            SDL20_ShowCursor(wanthide ? 0 : 1);
            VideoCursorHidden = wanthide;
            UpdateRelativeMouseMode();
        }
    }
    return retval;
}